

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sVertexArrayTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Stress::anon_unknown_1::SingleVertexArrayFirstGroup::init
          (SingleVertexArrayFirstGroup *this,EVP_PKEY_CTX *ctx)

{
  int t;
  int t_00;
  GLValue min_;
  GLValue max_;
  int in_EAX;
  InputType IVar1;
  int iVar2;
  int iVar3;
  MultiVertexArrayTest *this_00;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  InputType IVar8;
  bool bVar9;
  GLValue GVar10;
  GLValue GVar11;
  undefined4 uStack_1d4;
  undefined4 uStack_1c4;
  Spec spec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string name;
  string local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  ArraySpec arraySpec;
  
  lVar5 = 0;
  do {
    if (lVar5 == 2) {
      return in_EAX;
    }
    for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 4) {
          IVar8 = this->m_type;
          IVar1 = IVar8 & ~INPUTTYPE_FIXED;
          if (lVar6 == 0) {
            iVar2 = 8;
            if (IVar1 != INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
              iVar2 = deqp::gls::Array::inputTypeSize(IVar8);
              iVar2 = iVar2 * 2;
              IVar8 = this->m_type;
              goto LAB_011c4f60;
            }
LAB_011c4f46:
            iVar3 = deqp::gls::Array::inputTypeSize(IVar8);
            iVar3 = iVar3 << 2;
          }
          else {
            iVar2 = (&DAT_01881188)[lVar6];
            if (IVar1 == INPUTTYPE_UNSIGNED_INT_2_10_10_10) goto LAB_011c4f46;
LAB_011c4f60:
            iVar3 = deqp::gls::Array::inputTypeSize(IVar8);
          }
          if (iVar2 % iVar3 == 0) {
            bVar9 = (int)(&DAT_0183d200)[lVar5] % iVar3 == 0;
          }
          else {
            bVar9 = false;
          }
          iVar3 = *(int *)(&DAT_0181a4d8 + lVar4);
          typeToString<int>(&local_f0,iVar3);
          std::operator+(&local_d0,"first",&local_f0);
          std::operator+(&local_190,&local_d0,"_offset");
          t = (&DAT_0183d200)[lVar5];
          typeToString<int>(&local_110,t);
          std::operator+(&local_b0,&local_190,&local_110);
          std::operator+(&local_170,&local_b0,"_stride");
          typeToString<int>(&local_130,iVar2);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&spec,
                         &local_170,&local_130);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &arraySpec,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&spec,
                         "_quads");
          t_00 = (&DAT_0181a4d0)[lVar7];
          typeToString<int>(&local_90,t_00);
          std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &arraySpec,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&arraySpec);
          std::__cxx11::string::~string((string *)&spec);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_f0);
          IVar8 = this->m_type;
          GVar10 = deqp::gls::GLValue::getMinValue(IVar8);
          GVar11 = deqp::gls::GLValue::getMaxValue(this->m_type);
          max_._4_4_ = uStack_1d4;
          max_.type = GVar11.type;
          min_._4_4_ = uStack_1c4;
          min_.type = GVar10.type;
          min_.field_1 = GVar10.field_1;
          max_.field_1 = GVar11.field_1;
          deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                    (&arraySpec,IVar8,OUTPUTTYPE_VEC2,STORAGE_BUFFER,USAGE_DYNAMIC_DRAW,
                     (uint)(IVar1 == INPUTTYPE_UNSIGNED_INT_2_10_10_10) * 2 + 2,t,iVar2,false,min_,
                     max_);
          spec.arrays.
          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          spec.arrays.
          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          spec.arrays.
          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          spec.primitive = PRIMITIVE_TRIANGLES;
          spec.drawCount = t_00;
          spec.first = iVar3;
          std::
          vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ::push_back(&spec.arrays,&arraySpec);
          if (!bVar9) {
            this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
            deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                      (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                               m_testCtx,((this->super_TestCaseGroup).m_context)->m_renderCtx,&spec,
                       name._M_dataplus._M_p,name._M_dataplus._M_p);
            tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
          }
          std::
          _Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ::~_Vector_base(&spec.arrays.
                           super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                         );
          std::__cxx11::string::~string((string *)&name);
        }
        in_EAX = 8;
      }
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void SingleVertexArrayFirstGroup::init (void)
{
	int					counts[]		= {5, 256};
	int					firsts[]		= {6, 24};
	int					offsets[]		= {1, 17};
	int					strides[]		= {/*0,*/ -1, 17, 32}; // Tread negative value as sizeof input. Same as 0, but done outside of GL.

	for (int offsetNdx = 0; offsetNdx < DE_LENGTH_OF_ARRAY(offsets); offsetNdx++)
	{
		for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
		{
			for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
			{
				for (int firstNdx = 0; firstNdx < DE_LENGTH_OF_ARRAY(firsts); firstNdx++)
				{
					const bool	packed			= m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10;
					const int	componentCount	= (packed) ? (4) : (2);
					const int	stride			= (strides[strideNdx] < 0) ? ((packed) ? (8) : (Array::inputTypeSize(m_type) * componentCount)) : (strides[strideNdx]);
					const int	alignment		= (packed) ? (Array::inputTypeSize(m_type) * componentCount) : (Array::inputTypeSize(m_type));
					const bool	aligned			= ((stride % alignment) == 0) && ((offsets[offsetNdx] % alignment) == 0);
					std::string name			= "first" + typeToString(firsts[firstNdx]) + "_offset" + typeToString(offsets[offsetNdx]) + "_stride" + typeToString(stride) + "_quads" + typeToString(counts[countNdx]);

					MultiVertexArrayTest::Spec::ArraySpec arraySpec(m_type,
																	Array::OUTPUTTYPE_VEC2,
																	Array::STORAGE_BUFFER,
																	Array::USAGE_DYNAMIC_DRAW,
																	componentCount,
																	offsets[offsetNdx],
																	stride,
																	false,
																	GLValue::getMinValue(m_type),
																	GLValue::getMaxValue(m_type));

					MultiVertexArrayTest::Spec spec;
					spec.primitive	= Array::PRIMITIVE_TRIANGLES;
					spec.drawCount	= counts[countNdx];
					spec.first		= firsts[firstNdx];
					spec.arrays.push_back(arraySpec);

					if (!aligned)
						addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
				}
			}
		}
	}
}